

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controlbits.c
# Opt level: O3

void merge(int n,uint32_t *x,int step)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  
  if (n == 1) {
    uVar1 = *x;
    uVar2 = (int)(x[step] - uVar1) >> 0x1f & (uVar1 ^ x[step]);
    *x = uVar1 ^ uVar2;
    x[step] = x[step] ^ uVar2;
  }
  else {
    merge(n / 2,x,step * 2);
    lVar4 = (long)step;
    merge(n / 2,x + lVar4,step * 2);
    if (1 < n) {
      lVar3 = 1;
      do {
        uVar1 = x[lVar4];
        uVar2 = (int)(x[lVar4 * 2] - uVar1) >> 0x1f & (uVar1 ^ x[lVar4 * 2]);
        x[lVar4] = uVar1 ^ uVar2;
        x[lVar4 * 2] = x[lVar4 * 2] ^ uVar2;
        lVar3 = lVar3 + 2;
        x = x + lVar4 * 2;
      } while (lVar3 < n * 2 + -1);
    }
  }
  return;
}

Assistant:

static void merge(int n,uint32_t x[n],int step)
{
  int i;
  if (n == 1)
    minmax(&x[0],&x[step]);
  else {
    merge(n / 2,x,step * 2);
    merge(n / 2,x + step,step * 2);
    for (i = 1;i < 2*n-1;i += 2)
      minmax(&x[i * step],&x[(i + 1) * step]);
  }
}